

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateStream
              (xmlSchemaValidCtxtPtr ctxt,xmlParserInputBufferPtr input,xmlCharEncoding enc,
              xmlSAXHandler *sax,void *user_data)

{
  int iVar1;
  xmlParserInputPtr value;
  int local_4c;
  int ret;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr pctxt;
  void *user_data_local;
  xmlSAXHandler *sax_local;
  xmlCharEncoding enc_local;
  xmlParserInputBufferPtr input_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaValidCtxtPtr)0x0) || (input == (xmlParserInputBufferPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (sax == (xmlSAXHandler *)0x0) {
      inputStream = (xmlParserInputPtr)xmlNewParserCtxt();
      if ((xmlParserCtxtPtr)inputStream == (xmlParserCtxtPtr)0x0) {
        return -1;
      }
      (*xmlFree)(((xmlParserCtxtPtr)inputStream)->sax);
      ((xmlParserCtxtPtr)inputStream)->sax = (_xmlSAXHandler *)0x0;
    }
    else {
      inputStream = (xmlParserInputPtr)xmlNewSAXParserCtxt(sax,user_data);
      if ((xmlParserCtxtPtr)inputStream == (xmlParserCtxtPtr)0x0) {
        return -1;
      }
    }
    value = xmlNewIOInputStream((xmlParserCtxtPtr)inputStream,input,enc);
    if (value == (xmlParserInputPtr)0x0) {
      local_4c = -1;
    }
    else {
      iVar1 = xmlCtxtPushInput((xmlParserCtxtPtr)inputStream,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        local_4c = -1;
      }
      else {
        ctxt->enc = enc;
        local_4c = xmlSchemaValidateStreamInternal(ctxt,(xmlParserCtxtPtr)inputStream);
      }
    }
    if (inputStream != (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)inputStream);
    }
    ctxt_local._4_4_ = local_4c;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchemaValidateStream(xmlSchemaValidCtxtPtr ctxt,
                        xmlParserInputBufferPtr input, xmlCharEncoding enc,
                        const xmlSAXHandler *sax, void *user_data)
{
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr inputStream = NULL;
    int ret;

    if ((ctxt == NULL) || (input == NULL))
        return (-1);

    /*
     * prepare the parser
     */
    if (sax != NULL) {
        pctxt = xmlNewSAXParserCtxt(sax, user_data);
        if (pctxt == NULL)
            return (-1);
    } else {
        pctxt = xmlNewParserCtxt();
        if (pctxt == NULL)
            return (-1);
        /* We really want pctxt->sax to be NULL here. */
        xmlFree(pctxt->sax);
        pctxt->sax = NULL;
    }
#if 0
    if (options)
        xmlCtxtUseOptions(pctxt, options);
#endif

    inputStream = xmlNewIOInputStream(pctxt, input, enc);;
    if (inputStream == NULL) {
        ret = -1;
	goto done;
    }
    if (xmlCtxtPushInput(pctxt, inputStream) < 0) {
        xmlFreeInputStream(inputStream);
        ret = -1;
        goto done;
    }

    ctxt->enc = enc;

    ret = xmlSchemaValidateStreamInternal(ctxt, pctxt);

done:
    /* cleanup */
    if (pctxt != NULL) {
	xmlFreeParserCtxt(pctxt);
    }
    return (ret);
}